

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cpp
# Opt level: O2

PSNodesSeq * __thiscall
dg::pta::LLVMPointerGraphBuilder::createAtomicRMW(LLVMPointerGraphBuilder *this,Instruction *Inst)

{
  PSNodesSeq *pPVar1;
  PSNode *pPVar2;
  uint uVar3;
  Instruction *pIVar4;
  PSNode *M;
  PSNode *ptr;
  Offset cval;
  PSNodesSeq ret;
  PSNode *local_a0;
  PSNode *local_98;
  Offset local_90;
  PSNode *local_88;
  PSNode *local_80;
  initializer_list<dg::pta::PSNode_*> local_78;
  PSNodesSeq local_68;
  PSNodesSeq local_48;
  
  pIVar4 = (Instruction *)0x0;
  if (Inst[0x10] == (Instruction)0x40) {
    pIVar4 = Inst;
  }
  uVar3 = *(ushort *)(pIVar4 + 0x12) >> 4 & 0xf;
  if (2 < (ushort)uVar3) {
    pPVar1 = createUnknown(this,(Value *)Inst);
    return pPVar1;
  }
  local_98 = getOperand(this,*(Value **)(pIVar4 + -0x40));
  local_90.offset = Offset::UNKNOWN;
  pPVar2 = PointerGraph::create<(dg::pta::PSNodeType)2,dg::pta::PSNode*&>
                     ((PointerGraph *)this,&local_98);
  local_a0 = (PSNode *)0x0;
  if ((ushort)uVar3 != 2) {
    if (uVar3 == 1) {
      local_90.offset = llvmutils::getConstantValue(*(Value **)(pIVar4 + -0x20));
      local_a0 = PointerGraph::create<(dg::pta::PSNodeType)4,dg::pta::PSNode*&,dg::Offset&>
                           ((PointerGraph *)this,&local_98,&local_90);
      SubgraphNode<dg::pta::PSNode>::addSuccessor
                (&pPVar2->super_SubgraphNode<dg::pta::PSNode>,local_a0);
    }
    else {
      local_a0 = getOperand(this,*(Value **)(pIVar4 + -0x20));
    }
  }
  local_80 = PointerGraph::create<(dg::pta::PSNodeType)3,dg::pta::PSNode*&,dg::pta::PSNode*&>
                       ((PointerGraph *)this,&local_a0,&local_98);
  if (uVar3 - 1 < 2) {
    SubgraphNode<dg::pta::PSNode>::addSuccessor
              (&local_a0->super_SubgraphNode<dg::pta::PSNode>,local_80);
  }
  local_78._M_array = &local_88;
  local_78._M_len = 2;
  local_88 = pPVar2;
  PSNodesSeq::PSNodesSeq(&local_48,&local_78);
  PSNodesSeq::PSNodesSeq(&local_68,&local_48);
  pPVar1 = addNode(this,(Value *)Inst,&local_68);
  std::_Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::~_Vector_base
            ((_Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)&local_68);
  std::_Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::~_Vector_base
            ((_Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)&local_48);
  return pPVar1;
}

Assistant:

LLVMPointerGraphBuilder::PSNodesSeq &
LLVMPointerGraphBuilder::createAtomicRMW(const llvm::Instruction *Inst) {
    using namespace llvm;

    const auto *RMW = dyn_cast<AtomicRMWInst>(Inst);
    assert(RMW && "Wrong instruction");

    auto operation = RMW->getOperation();
    if (operation != AtomicRMWInst::Xchg && operation != AtomicRMWInst::Add &&
        operation != AtomicRMWInst::Sub) {
        return createUnknown(Inst);
    }

    auto *ptr = getOperand(RMW->getPointerOperand());
    Offset cval = Offset::UNKNOWN;

    auto *R = PS.create<PSNodeType::LOAD>(ptr);

    PSNode *M = nullptr;
    switch (operation) {
    case AtomicRMWInst::Xchg:
        M = getOperand(RMW->getValOperand());
        break;
    case AtomicRMWInst::Add:
        cval = Offset(llvmutils::getConstantValue(RMW->getValOperand()));
        M = PS.create<PSNodeType::GEP>(ptr, cval);
        R->addSuccessor(M);
        break;
    case AtomicRMWInst::Sub:
        break;
        cval = Offset(0) -
               Offset(llvmutils::getConstantValue(RMW->getValOperand()));
        M = PS.create<PSNodeType::GEP>(ptr, cval);
        R->addSuccessor(M);
        break;
    default:
        assert(false && "Invalid operation");
        abort();
    }
    assert(M);

    auto *W = PS.create<PSNodeType::STORE>(M, ptr);
    if (operation == AtomicRMWInst::Add || operation == AtomicRMWInst::Sub) {
        M->addSuccessor(W);
    }

    PSNodesSeq ret({R, W});
    return addNode(Inst, ret);
}